

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid_x86::forward_inplace(HardSigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar7 [16];
  __m128 _ans;
  __m128 _p;
  __m128 _one;
  __m128 _zero;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  int local_268;
  float *local_210;
  int local_204;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  
  lVar5 = in_RSI[7];
  iVar6 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
          (int)in_RSI[3];
  for (local_204 = 0; local_204 < (int)lVar5; local_204 = local_204 + 1) {
    local_210 = (float *)(*in_RSI + in_RSI[8] * (long)local_204 * in_RSI[2]);
    for (local_268 = 0; local_268 + 3 < iVar6; local_268 = local_268 + 4) {
      fVar2 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      fVar3 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_f8 = (float)*(undefined8 *)local_210;
      fStack_f4 = (float)((ulong)*(undefined8 *)local_210 >> 0x20);
      fStack_f0 = (float)*(undefined8 *)(local_210 + 2);
      fStack_ec = (float)((ulong)*(undefined8 *)(local_210 + 2) >> 0x20);
      local_2a8 = CONCAT44(fStack_f4 * fVar3 + fVar2,local_f8 * fVar3 + fVar2);
      uStack_2a0._0_4_ = fStack_f0 * fVar3 + fVar2;
      uStack_2a0._4_4_ = fStack_ec * fVar3 + fVar2;
      auVar7._8_8_ = uStack_2a0;
      auVar7._0_8_ = local_2a8;
      auVar7 = maxps(auVar7,ZEXT816(0));
      auVar4._8_8_ = 0x3f8000003f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      auVar7 = minps(auVar7,auVar4);
      local_2a8 = auVar7._0_8_;
      uStack_2a0 = auVar7._8_8_;
      *(undefined8 *)local_210 = local_2a8;
      *(undefined8 *)(local_210 + 2) = uStack_2a0;
      local_210 = local_210 + 4;
    }
    for (; local_268 < iVar6; local_268 = local_268 + 1) {
      if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *local_210) {
        pfVar1 = (float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
        if (*local_210 < *pfVar1 || *local_210 == *pfVar1) {
          *local_210 = *local_210 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                       *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        else {
          *local_210 = 1.0;
        }
      }
      else {
        *local_210 = 0.0;
      }
      local_210 = local_210 + 1;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}